

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O3

void __thiscall OpenMD::RigidBody::calcForcesAndTorques(RigidBody *this)

{
  double *pdVar1;
  DataStoragePointer DVar2;
  Snapshot *pSVar3;
  Atom *pAVar4;
  AtomType *this_00;
  double dVar5;
  bool bVar6;
  uint i;
  uint uVar7;
  long lVar8;
  pointer ppAVar9;
  long lVar10;
  int iVar11;
  uint i_4;
  uint i_5;
  long lVar12;
  ulong uVar13;
  Vector3d afrc;
  Vector3d apos;
  Vector3d atrq;
  double local_128 [4];
  double local_108 [4];
  double local_e8 [4];
  double local_c8 [4];
  double local_a8 [4];
  double local_88 [4];
  double local_68 [4];
  double local_48 [4];
  
  local_c8[0] = 0.0;
  local_c8[1] = 0.0;
  uVar13 = 0;
  local_c8[2] = 0.0;
  local_68[2] = 0.0;
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  local_88[2] = 0.0;
  local_88[0] = 0.0;
  local_88[1] = 0.0;
  local_a8[2] = 0.0;
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  local_128[2] = 0.0;
  local_128[0] = 0.0;
  local_128[1] = 0.0;
  local_e8[2] = 0.0;
  local_e8[0] = 0.0;
  local_e8[1] = 0.0;
  DVar2 = (this->super_StuntDouble).storage_;
  pSVar3 = ((this->super_StuntDouble).snapshotMan_)->currentSnapshot_;
  lVar10 = (long)(this->super_StuntDouble).localIndex_;
  lVar8 = *(long *)((long)&(pSVar3->atomData).position.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + DVar2);
  local_48[2] = *(double *)(lVar8 + 0x10 + lVar10 * 0x18);
  pdVar1 = (double *)(lVar8 + lVar10 * 0x18);
  local_48[0] = *pdVar1;
  local_48[1] = pdVar1[1];
  uVar7 = DataStorage::getStorageLayout
                    ((DataStorage *)
                     ((long)&(pSVar3->atomData).position.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + DVar2));
  ppAVar9 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
      super__Vector_impl_data._M_finish == ppAVar9) {
    dVar5 = 0.0;
  }
  else {
    iVar11 = 0;
    do {
      pAVar4 = ppAVar9[uVar13];
      this_00 = pAVar4->atomType_;
      DVar2 = (pAVar4->super_StuntDouble).storage_;
      pSVar3 = ((pAVar4->super_StuntDouble).snapshotMan_)->currentSnapshot_;
      lVar8 = *(long *)((long)&(pSVar3->atomData).force.
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + DVar2);
      lVar10 = (long)(pAVar4->super_StuntDouble).localIndex_ * 0x18;
      local_c8[2] = *(double *)(lVar8 + 0x10 + lVar10);
      pdVar1 = (double *)(lVar8 + lVar10);
      local_c8[0] = *pdVar1;
      local_c8[1] = pdVar1[1];
      lVar8 = *(long *)((long)&(pSVar3->atomData).position.
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + DVar2);
      pdVar1 = (double *)(lVar8 + lVar10);
      local_88[0] = *pdVar1;
      local_88[1] = pdVar1[1];
      local_88[2] = (double)*(undefined8 *)(lVar8 + 0x10 + lVar10);
      local_108[0] = 0.0;
      local_108[1] = 0.0;
      local_108[2] = 0.0;
      lVar8 = 0;
      do {
        local_108[lVar8] = local_88[lVar8] - local_48[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      lVar8 = 0;
      do {
        local_a8[lVar8] = local_c8[lVar8] + local_a8[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      local_128[0] = (local_c8[2] * local_108[1] - local_108[2] * local_c8[1]) + local_128[0];
      local_128[1] = (local_c8[0] * local_108[2] - local_108[0] * local_c8[2]) + local_128[1];
      local_128[2] = (local_108[0] * local_c8[1] - local_c8[0] * local_108[1]) + local_128[2];
      bVar6 = AtomType::isDirectional(this_00);
      if (bVar6) {
        pAVar4 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar13];
        lVar10 = (long)(pAVar4->super_StuntDouble).localIndex_;
        lVar8 = *(long *)((long)&(((pAVar4->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                 atomData).torque.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         + (pAVar4->super_StuntDouble).storage_);
        local_68[2] = (double)*(undefined8 *)(lVar8 + 0x10 + lVar10 * 0x18);
        pdVar1 = (double *)(lVar8 + lVar10 * 0x18);
        local_68[0] = *pdVar1;
        local_68[1] = pdVar1[1];
        lVar8 = 0;
        do {
          local_128[lVar8] = local_68[lVar8] + local_128[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
      }
      if ((uVar7 >> 0xc & 1) == 0) {
        ppAVar9 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      else {
        bVar6 = AtomType::isElectrostatic(this_00);
        ppAVar9 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (bVar6) {
          pAVar4 = ppAVar9[uVar13];
          lVar10 = (long)(pAVar4->super_StuntDouble).localIndex_;
          lVar8 = *(long *)((long)&(((pAVar4->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                   atomData).electricField.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start +
                           (pAVar4->super_StuntDouble).storage_);
          local_108[2] = (double)*(undefined8 *)(lVar8 + 0x10 + lVar10 * 0x18);
          pdVar1 = (double *)(lVar8 + lVar10 * 0x18);
          local_108[0] = *pdVar1;
          local_108[1] = pdVar1[1];
          lVar8 = 0;
          do {
            local_e8[lVar8] = local_108[lVar8] + local_e8[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          iVar11 = iVar11 + 1;
        }
      }
      uVar13 = (ulong)((int)uVar13 + 1);
    } while (uVar13 < (ulong)((long)(this->atoms_).
                                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar9 >> 3)
            );
    dVar5 = (double)iVar11;
  }
  DVar2 = (this->super_StuntDouble).storage_;
  pSVar3 = ((this->super_StuntDouble).snapshotMan_)->currentSnapshot_;
  lVar8 = (long)(this->super_StuntDouble).localIndex_;
  lVar10 = *(long *)((long)&(pSVar3->atomData).force.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + DVar2) + lVar8 * 0x18;
  lVar12 = 0;
  do {
    *(double *)(lVar10 + lVar12 * 8) = local_a8[lVar12] + *(double *)(lVar10 + lVar12 * 8);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  lVar10 = lVar8 * 0x18 +
           *(long *)((long)&(pSVar3->atomData).torque.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + DVar2);
  lVar12 = 0;
  do {
    *(double *)(lVar10 + lVar12 * 8) = local_128[lVar12] + *(double *)(lVar10 + lVar12 * 8);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  if ((uVar7 >> 0xc & 1) != 0) {
    lVar10 = 0;
    do {
      local_e8[lVar10] = local_e8[lVar10] / dVar5;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    lVar10 = *(long *)((long)&(pSVar3->atomData).electricField.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + DVar2);
    *(double *)(lVar10 + 0x10 + lVar8 * 0x18) = local_e8[2];
    pdVar1 = (double *)(lVar10 + lVar8 * 0x18);
    *pdVar1 = local_e8[0];
    pdVar1[1] = local_e8[1];
  }
  return;
}

Assistant:

void RigidBody::calcForcesAndTorques() {
    Vector3d afrc;
    Vector3d atrq;
    Vector3d apos;
    Vector3d rpos;
    Vector3d frc(0.0);
    Vector3d trq(0.0);
    Vector3d ef(0.0);
    Vector3d pos = this->getPos();
    AtomType* atype;
    int eCount = 0;

    int sl =
        ((snapshotMan_->getCurrentSnapshot())->*storage_).getStorageLayout();

    for (unsigned int i = 0; i < atoms_.size(); i++) {
      atype = atoms_[i]->getAtomType();

      afrc = atoms_[i]->getFrc();
      apos = atoms_[i]->getPos();
      rpos = apos - pos;

      frc += afrc;

      trq[0] += rpos[1] * afrc[2] - rpos[2] * afrc[1];
      trq[1] += rpos[2] * afrc[0] - rpos[0] * afrc[2];
      trq[2] += rpos[0] * afrc[1] - rpos[1] * afrc[0];

      // If the atom has a torque associated with it, then we also need to
      // migrate the torques onto the center of mass:

      if (atoms_[i]->isDirectional()) {
        atrq = atoms_[i]->getTrq();
        trq += atrq;
      }

      if ((sl & DataStorage::dslElectricField) && (atype->isElectrostatic())) {
        ef += atoms_[i]->getElectricField();
        eCount++;
      }
    }
    addFrc(frc);
    addTrq(trq);

    if (sl & DataStorage::dslElectricField) {
      ef /= eCount;
      setElectricField(ef);
    }
  }